

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O2

void ecx_readeeprom1(ecx_contextt *context,uint16 slave,uint16 eeproma)

{
  uint16 configadr;
  uint16 uVar1;
  int iVar2;
  undefined6 in_register_00000032;
  uint uVar3;
  bool bVar4;
  uint16 estat;
  ec_eepromt ed;
  
  ecx_eeprom2master(context,slave);
  configadr = context->slavelist[CONCAT62(in_register_00000032,slave) & 0xffffffff].configadr;
  uVar1 = ecx_eeprom_waitnotbusyFP(context,configadr,&estat,20000);
  if (uVar1 != 0) {
    if ((estat & 0x7800) != 0) {
      estat = 0;
      ecx_FPWR(context->port,configadr,0x502,2,&estat,6000);
    }
    ed.comm = 0x100;
    ed.d2 = 0;
    uVar3 = 0;
    ed.addr = eeproma;
    do {
      iVar2 = ecx_FPWR(context->port,configadr,0x502,6,&ed,2000);
      if (0 < iVar2) {
        return;
      }
      bVar4 = uVar3 < 3;
      uVar3 = uVar3 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void ecx_readeeprom1(ecx_contextt *context, uint16 slave, uint16 eeproma)
{
   uint16 configadr, estat;
   ec_eepromt ed;
   int wkc, cnt = 0;

   ecx_eeprom2master(context, slave); /* set eeprom control to master */
   configadr = context->slavelist[slave].configadr;
   if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, EC_TIMEOUTEEP))
   {
      if (estat & EC_ESTAT_EMASK) /* error bits are set */
      {
         estat = htoes(EC_ECMD_NOP); /* clear error bits */
         wkc = ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(estat), &estat, EC_TIMEOUTRET3);
      }
      ed.comm = htoes(EC_ECMD_READ);
      ed.addr = htoes(eeproma);
      ed.d2   = 0x0000;
      do
      {
         wkc = ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(ed), &ed, EC_TIMEOUTRET);
      }
      while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
   }
}